

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_json.c
# Opt level: O0

LY_ERR lydjson_create_opaq(lyd_json_ctx *lydctx,char *name,size_t name_len,char *prefix,
                          size_t prefix_len,lyd_node *parent,LYJSON_PARSER_STATUS *status_inner_p,
                          lyd_node **node_p)

{
  LY_ERR LVar1;
  uint32_t local_90;
  LY_ERR ret__;
  uint32_t type_hint;
  ly_bool dynamic;
  size_t module_name_len;
  size_t value_len;
  char *module_name;
  char *value;
  lyd_node *plStack_60;
  LY_ERR ret;
  lyd_node *parent_local;
  size_t prefix_len_local;
  char *prefix_local;
  size_t name_len_local;
  char *name_local;
  lyd_json_ctx *lydctx_local;
  
  value._4_4_ = 0;
  module_name = (char *)0x0;
  module_name_len = 0;
  _type_hint = 0;
  ret__._3_1_ = LY_SUCCESS >> 0x18;
  local_90 = 0;
  plStack_60 = parent;
  parent_local = (lyd_node *)prefix_len;
  prefix_len_local = (size_t)prefix;
  prefix_local = (char *)name_len;
  name_len_local = (size_t)name;
  name_local = (char *)lydctx;
  if (*status_inner_p != LYJSON_OBJECT) {
    module_name = lydctx->jsonctx->value;
    module_name_len = lydctx->jsonctx->value_len;
    ret__._3_1_ = lydctx->jsonctx->dynamic;
    lydctx->jsonctx->dynamic = '\0';
    LVar1 = lydjson_value_type_hint(lydctx->jsonctx,status_inner_p,&local_90);
    if (LVar1 != LY_SUCCESS) {
      return LVar1;
    }
  }
  lydjson_get_node_prefix
            (plStack_60,(char *)prefix_len_local,(size_t)parent_local,(char **)&value_len,
             (size_t *)&type_hint);
  if (((value_len == 0) && (plStack_60 == (lyd_node *)0x0)) && (*(long *)(name_local + 0x1080) != 0)
     ) {
    value_len = *(undefined8 *)(*(long *)(*(long *)(name_local + 0x1080) + 8) + 8);
    _type_hint = strlen((char *)value_len);
  }
  value._4_4_ = lyd_create_opaq((ly_ctx *)**(undefined8 **)(name_local + 0x1078),
                                (char *)name_len_local,(size_t)prefix_local,(char *)prefix_len_local
                                ,(size_t)parent_local,(char *)value_len,_type_hint,module_name,
                                module_name_len,(byte *)((long)&ret__ + 3),LY_VALUE_JSON,(void *)0x0
                                ,local_90,node_p);
  if (ret__._3_1_ != LY_SUCCESS >> 0x18) {
    free(module_name);
  }
  return value._4_4_;
}

Assistant:

static LY_ERR
lydjson_create_opaq(struct lyd_json_ctx *lydctx, const char *name, size_t name_len, const char *prefix, size_t prefix_len,
        struct lyd_node *parent, enum LYJSON_PARSER_STATUS *status_inner_p, struct lyd_node **node_p)
{
    LY_ERR ret = LY_SUCCESS;
    const char *value = NULL, *module_name;
    size_t value_len = 0, module_name_len = 0;
    ly_bool dynamic = 0;
    uint32_t type_hint = 0;

    if (*status_inner_p != LYJSON_OBJECT) {
        /* prepare for creating opaq node with a value */
        value = lydctx->jsonctx->value;
        value_len = lydctx->jsonctx->value_len;
        dynamic = lydctx->jsonctx->dynamic;
        lydctx->jsonctx->dynamic = 0;

        LY_CHECK_RET(lydjson_value_type_hint(lydctx->jsonctx, status_inner_p, &type_hint));
    }

    /* get the module name */
    lydjson_get_node_prefix(parent, prefix, prefix_len, &module_name, &module_name_len);
    if (!module_name && !parent && lydctx->any_schema) {
        /* in an anyxml/anydata tree, parsing first node, use the previous any schema node */
        module_name = lydctx->any_schema->module->name;
        module_name_len = strlen(module_name);
    }

    /* create node */
    ret = lyd_create_opaq(lydctx->jsonctx->ctx, name, name_len, prefix, prefix_len, module_name, module_name_len, value,
            value_len, &dynamic, LY_VALUE_JSON, NULL, type_hint, node_p);
    if (dynamic) {
        free((char *)value);
    }

    return ret;
}